

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackgroundCommand.cpp
# Opt level: O2

void __thiscall senjo::PerftCommandHandle::Execute(PerftCommandHandle *this)

{
  ChessEngine *pCVar1;
  FILE *__stream;
  uint64_t uVar2;
  uint64_t uVar3;
  bool bVar4;
  int iVar5;
  char *pcVar6;
  char *pcVar7;
  undefined4 extraout_var;
  uint64_t uVar8;
  int *piVar9;
  int iVar10;
  int line;
  int iVar11;
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  char *f;
  FILE *local_4080;
  string *local_4078;
  double dStack_4070;
  uint64_t nodes;
  uint64_t pcount;
  Output local_4050;
  uint64_t qnodes;
  uint64_t local_4040;
  char fen [16384];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  
  pCVar1 = (this->super_BackgroundCommand).engine;
  if (pCVar1 == (ChessEngine *)0x0) {
    Output::Output((Output *)fen,InfoPrefix);
    std::operator<<((ostream *)&std::cout,"Engine not set for \'");
    std::operator<<((ostream *)&std::cout,(string *)&this->command);
    std::operator<<((ostream *)&std::cout,"\' command");
  }
  else {
    (*pCVar1->_vptr_ChessEngine[0x1e])();
    if ((this->fileName)._M_string_length == 0) {
      pCVar1 = (this->super_BackgroundCommand).engine;
      if (this->qperft == true) {
        ChessEngine::QPerft(pCVar1,this->maxDepth);
        return;
      }
      ChessEngine::Perft(pCVar1,this->maxDepth);
      return;
    }
    local_4078 = (string *)&this->fileName;
    local_4080 = fopen((((string *)local_4078)->_M_dataplus)._M_p,"r");
    if (local_4080 != (FILE *)0x0) {
      local_4040 = Now();
      pcount = 0;
      nodes = 0;
      qnodes = 0;
      bVar4 = false;
      iVar11 = 1;
      iVar5 = 0;
      do {
        if ((bVar4) || (pcVar6 = fgets(fen,0x4000,local_4080), pcVar6 == (char *)0x0))
        goto LAB_0013b748;
        f = fen;
        pcVar7 = NextWord(&f);
        pcVar6 = f;
        if ((*pcVar7 == '\0') || (*f == '#')) {
          bVar4 = false;
          iVar10 = iVar5;
        }
        else {
          iVar10 = iVar5 + 1;
          if (this->skip < 1 || this->skip <= iVar5) {
            Output::Output(&local_4050,InfoPrefix);
            std::operator<<((ostream *)&std::cout,local_4078);
            std::operator<<((ostream *)&std::cout," line ");
            std::ostream::operator<<((ostream *)&std::cout,iVar11);
            std::operator<<((ostream *)&std::cout,' ');
            std::operator<<((ostream *)&std::cout,pcVar6);
            Output::~Output(&local_4050);
            NormalizeString(&f);
            pCVar1 = (this->super_BackgroundCommand).engine;
            iVar5 = (*pCVar1->_vptr_ChessEngine[9])(pCVar1,f);
            f = (char *)CONCAT44(extraout_var,iVar5);
            if (f == (char *)0x0) {
LAB_0013b748:
              uVar8 = Now();
              uVar3 = local_4040;
              __stream = local_4080;
              local_4078 = (string *)(uVar8 - local_4040);
              dStack_4070 = 0.0;
              if (this->qperft == true) {
                Output::Output((Output *)&f,InfoPrefix);
                std::operator<<((ostream *)&std::cout,"Total QPerft ");
                uVar2 = pcount;
                std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
                std::operator<<((ostream *)&std::cout,' ');
                dVar12 = 0.0;
                if (uVar8 != uVar3) {
                  auVar19._12_4_ = (undefined4)((ulong)dStack_4070 >> 0x20);
                  auVar19._8_4_ = (int)((ulong)local_4078 >> 0x20);
                  auVar19._0_8_ = local_4078;
                  auVar18._8_8_ = auVar19._8_8_;
                  auVar18._0_8_ = (double)CONCAT44(0x43300000,(int)local_4078);
                  auVar20._0_12_ = auVar18._0_12_;
                  auVar20._12_4_ = 0x45300000;
                  dVar12 = ((double)(uVar2 / 1000) /
                           ((auVar20._8_8_ - 1.9342813113834067e+25) +
                           (auVar18._0_8_ - 4503599627370496.0))) * 1000.0;
                }
                std::ostream::_M_insert<double>(dVar12);
                std::operator<<((ostream *)&std::cout," KNodes/sec");
                Output::~Output((Output *)&f);
                Output::Output((Output *)&f,InfoPrefix);
                std::operator<<((ostream *)&std::cout,"Total Snodes ");
                uVar3 = qnodes;
                std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
                std::operator<<((ostream *)&std::cout,", Qnodes ");
                std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
                std::operator<<((ostream *)&std::cout," (");
                dVar12 = 0.0;
                if (uVar2 != 0) {
                  auVar16._8_4_ = (int)(uVar3 >> 0x20);
                  auVar16._0_8_ = uVar3;
                  auVar16._12_4_ = 0x45300000;
                  auVar17._8_4_ = (int)(uVar2 >> 0x20);
                  auVar17._0_8_ = uVar2;
                  auVar17._12_4_ = 0x45300000;
                  dVar12 = (((auVar16._8_8_ - 1.9342813113834067e+25) +
                            ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0)) /
                           ((auVar17._8_8_ - 1.9342813113834067e+25) +
                           ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0))) * 100.0;
                }
                std::ostream::_M_insert<double>(dVar12);
                std::operator<<((ostream *)&std::cout,"%)");
              }
              else {
                Output::Output((Output *)&f,InfoPrefix);
                std::operator<<((ostream *)&std::cout,"Total Perft ");
                uVar2 = pcount;
                std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
                std::operator<<((ostream *)&std::cout,' ');
                auVar14._12_4_ = (undefined4)((ulong)dStack_4070 >> 0x20);
                auVar14._8_4_ = (int)((ulong)local_4078 >> 0x20);
                auVar14._0_8_ = local_4078;
                auVar13._8_8_ = auVar14._8_8_;
                auVar13._0_8_ = (double)CONCAT44(0x43300000,(int)local_4078);
                auVar15._0_12_ = auVar13._0_12_;
                auVar15._12_4_ = 0x45300000;
                dStack_4070 = auVar15._8_8_ - 1.9342813113834067e+25;
                local_4078 = (string *)(dStack_4070 + (auVar13._0_8_ - 4503599627370496.0));
                dVar12 = 0.0;
                if (uVar8 != uVar3) {
                  dVar12 = ((double)(uVar2 / 1000) / (double)local_4078) * 1000.0;
                }
                std::ostream::_M_insert<double>(dVar12);
                std::operator<<((ostream *)&std::cout," KLeafs/sec");
                Output::~Output((Output *)&f);
                Output::Output((Output *)&f,InfoPrefix);
                std::operator<<((ostream *)&std::cout,"Total Nodes ");
                uVar2 = nodes;
                std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
                std::operator<<((ostream *)&std::cout,' ');
                dVar12 = 0.0;
                if (uVar8 != uVar3) {
                  dVar12 = ((double)(uVar2 / 1000) / (double)local_4078) * 1000.0;
                }
                std::ostream::_M_insert<double>(dVar12);
                std::operator<<((ostream *)&std::cout," KNodes/sec");
              }
              Output::~Output((Output *)&f);
              if (__stream == (FILE *)0x0) {
                return;
              }
              fclose(__stream);
              return;
            }
            while (*f != '\0') {
              pcVar6 = strchr(f,0x3b);
              if (pcVar6 != (char *)0x0) {
                *pcVar6 = '\0';
              }
              pcVar7 = NextWord(&f);
              if ((*pcVar7 == 'D') && ((int)f[1] - 0x30U < 10)) {
                bVar4 = Process(this,f,&pcount,&nodes,&qnodes);
                if (pcVar6 == (char *)0x0 || !bVar4) {
                  bVar4 = !bVar4;
                  goto LAB_0013b6e1;
                }
              }
              else if (pcVar6 == (char *)0x0) break;
              f = pcVar6 + 1;
            }
            bVar4 = false;
LAB_0013b6e1:
            if (this->count <= iVar10 && 0 < this->count) goto LAB_0013b748;
          }
          else {
            bVar4 = false;
          }
        }
        iVar11 = iVar11 + 1;
        iVar5 = iVar10;
      } while( true );
    }
    Output::Output((Output *)fen,InfoPrefix);
    std::operator<<((ostream *)&std::cout,"Cannot open \'");
    std::operator<<((ostream *)&std::cout,local_4078);
    std::operator<<((ostream *)&std::cout,"\': ");
    piVar9 = __errno_location();
    pcVar6 = strerror(*piVar9);
    std::operator<<((ostream *)&std::cout,pcVar6);
  }
  Output::~Output((Output *)fen);
  return;
}

Assistant:

void PerftCommandHandle::Execute()
{
  if (!engine) {
    Output() << "Engine not set for '" << command << "' command";
    return;
  }

  engine->ClearStopFlags();

  if (fileName.empty()) {
    if (qperft) {
      engine->QPerft(maxDepth);
    }
    else {
      engine->Perft(maxDepth);
    }
    return;
  }

  FILE* fp = NULL;
  try {
    if (!(fp = fopen(fileName.c_str(), "r"))) {
      Output() << "Cannot open '" << fileName << "': " << strerror(errno);
      return;
    }

    const uint64_t start = Now();
    uint64_t pcount = 0;
    uint64_t nodes = 0;
    uint64_t qnodes = 0;
    bool done = false;
    char fen[16384];
    int positions = 0;

    for (int line = 1; !done && fgets(fen, sizeof(fen), fp); ++line) {
      char* f = fen;
      if (!*NextWord(f) || (*f == '#')) {
        continue;
      }

      positions++;
      if ((skip > 0) && (positions <= skip)) {
        continue;
      }

      Output() << fileName << " line " << line << ' ' << f;
      NormalizeString(f);
      if (!(f = const_cast<char*>(engine->SetPosition(f)))) {
        break;
      }

      while (f && *f) {
        // null terminate this parameter (parameters end with ; or end of line)
        char* end = strchr(f, ';');
        if (end) {
          *end = 0;
        }

        // process "D<depth> <leafs>" parameters (e.g. D5 4865609)
        if ((*NextWord(f) == 'D') && isdigit(f[1])) {
          if (!Process(f, pcount, nodes, qnodes)) {
            done = true;
            break;
          }
        }

        // move 'f' to beginning of next parameter
        if (end) {
          f = (end + 1);
          continue;
        }
        break;
      }

      if ((count > 0) && (positions >= count)) {
        break;
      }
    }

    const uint64_t time = (Now() - start);
    if (qperft) {
      Output() << "Total QPerft " << pcount << ' '
               << Rate((pcount / 1000), time) << " KNodes/sec";
      Output() << "Total Snodes " << (nodes - qnodes) << ", Qnodes " << qnodes
               << " (" << Percent(qnodes, pcount) << "%)";
    }
    else {
      Output() << "Total Perft " << pcount << ' '
               << Rate((pcount / 1000), time) << " KLeafs/sec";
      Output() << "Total Nodes " << nodes << ' '
               << Rate((nodes / 1000), time) << " KNodes/sec";
    }
  }
  catch (const std::exception& e) {
    Output() << "ERROR: " << e.what();
  }
  catch (...) {
    Output() << "Unknown error!";
  }

  if (fp) {
    fclose(fp);
    fp = NULL;
  }
}